

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int tinyexr::NumScanlines(int compression_type)

{
  int num_scanlines;
  int compression_type_local;
  
  num_scanlines = 1;
  if (compression_type == 3) {
    num_scanlines = 0x10;
  }
  else if (compression_type == 4) {
    num_scanlines = 0x20;
  }
  else if (compression_type == 0x80) {
    num_scanlines = 0x10;
  }
  return num_scanlines;
}

Assistant:

static int NumScanlines(int compression_type) {
  int num_scanlines = 1;
  if (compression_type == TINYEXR_COMPRESSIONTYPE_ZIP) {
    num_scanlines = 16;
  } else if (compression_type == TINYEXR_COMPRESSIONTYPE_PIZ) {
    num_scanlines = 32;
  } else if (compression_type == TINYEXR_COMPRESSIONTYPE_ZFP) {
    num_scanlines = 16;
  }
  return num_scanlines;
}